

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O1

rf_image *
rf_gen_image_checked_to_buffer
          (rf_image *__return_storage_ptr__,int width,int height,int checks_x,int checks_y,
          rf_color col1,rf_color col2,rf_color *dst,rf_int dst_size)

{
  rf_color rVar1;
  long lVar2;
  long lVar3;
  rf_color *prVar4;
  
  __return_storage_ptr__->data = (void *)0x0;
  __return_storage_ptr__->width = 0;
  __return_storage_ptr__->height = 0;
  __return_storage_ptr__->format = 0;
  __return_storage_ptr__->valid = false;
  *(undefined3 *)&__return_storage_ptr__->field_0x15 = 0;
  if (width * height * 4 <= dst_size) {
    if (0 < height) {
      lVar3 = 0;
      prVar4 = dst;
      do {
        if (0 < width) {
          lVar2 = 0;
          do {
            rVar1 = col2;
            if (((int)(lVar2 / (long)checks_x) + (int)(lVar3 / (long)checks_y) & 1U) == 0) {
              rVar1 = col1;
            }
            prVar4[lVar2] = rVar1;
            lVar2 = lVar2 + 1;
          } while (width != lVar2);
        }
        lVar3 = lVar3 + 1;
        prVar4 = prVar4 + width;
      } while (lVar3 != height);
    }
    __return_storage_ptr__->data = dst;
    __return_storage_ptr__->width = width;
    __return_storage_ptr__->height = height;
    __return_storage_ptr__->format = RF_UNCOMPRESSED_R8G8B8A8;
    __return_storage_ptr__->valid = true;
  }
  return __return_storage_ptr__;
}

Assistant:

RF_API rf_image rf_gen_image_checked_to_buffer(int width, int height, int checks_x, int checks_y, rf_color col1, rf_color col2, rf_color* dst, rf_int dst_size)
{
    rf_image result = {0};

    if (dst_size >= width * height * rf_bytes_per_pixel(RF_UNCOMPRESSED_R8G8B8A8))
    {
        float radius = (width < height) ? ((float)width) / 2.0f : ((float)height) / 2.0f;

        float center_x = ((float)width ) / 2.0f;
        float center_y = ((float)height) / 2.0f;

        for (rf_int y = 0; y < height; y++)
        {
            for (rf_int x = 0; x < width; x++)
            {
                if ((x / checks_x + y / checks_y) % 2 == 0) dst[y * width + x] = col1;
                else dst[y * width + x] = col2;
            }
        }

        result = (rf_image)
        {
            .data = dst,
            .width = width,
            .height = height,
            .format = RF_UNCOMPRESSED_R8G8B8A8,
            .valid = true,
        };
    }

    return result;
}